

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::undefine(CTcTokenizer *this,char *sym,size_t len)

{
  int iVar1;
  CTcHashEntryPp *this_00;
  CTcHashEntryPp *pCVar2;
  CVmHashEntry *in_RDI;
  CTcHashEntryPp *entry;
  char *in_stack_ffffffffffffffc8;
  CTcTokenizer *in_stack_ffffffffffffffd0;
  
  this_00 = find_define(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x2ef51c);
  if ((this_00 != (CTcHashEntryPp *)0x0) &&
     (iVar1 = (*(this_00->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[7])(),
     iVar1 != 0)) {
    (**(code **)(*(long *)in_RDI[0x54].str_ + 0x18))(in_RDI[0x54].str_,this_00);
    pCVar2 = find_undef(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x2ef564);
    if (pCVar2 == (CTcHashEntryPp *)0x0) {
      CVmHashTable::add((CVmHashTable *)this_00,in_RDI);
    }
    else if (this_00 != (CTcHashEntryPp *)0x0) {
      (*(this_00->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[1])();
    }
  }
  return;
}

Assistant:

void CTcTokenizer::undefine(const char *sym, size_t len)
{
    CTcHashEntryPp *entry;

    /* 
     *   find the macro - if it wasn't defined, silently ignore it, since
     *   it's legal to #undef a symbol that wasn't previously defined 
     */
    entry = find_define(sym, len);
    if (entry != 0 && entry->is_undefable())
    {
        /* remove it */
        defines_->remove(entry);

        /* if it's not already in the #undef table, move it there */
        if (find_undef(sym, len) == 0)
        {
            /* move it to the #undef table */
            undefs_->add(entry);
        }
        else
        {
            /* 
             *   the name is already in the #undef table, so we don't need to
             *   add it again - we can forget about this entry entirely 
             */
            delete entry;
        }
    }
}